

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

void R_SetWindow(int windowSize,int fullWidth,int fullHeight,int stHeight,bool renderingToCanvas)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  DAngle DVar5;
  float trueratio;
  double local_30;
  
  freelookviewheight = fullHeight;
  viewwidth = fullWidth;
  viewheight = fullHeight;
  if ((windowSize < 0xb) && (viewheight = stHeight, windowSize != 10)) {
    viewwidth = (setblocks * fullWidth) / 10 & 0xfffffff0;
    viewheight = (setblocks * stHeight) / 10 & 0xfffffff8;
    freelookviewheight = (setblocks * fullHeight) / 10 & 0xfffffff8;
  }
  if (renderingToCanvas) {
    WidescreenRatio = (float)fullWidth / (float)fullHeight;
    trueratio = WidescreenRatio;
  }
  else {
    WidescreenRatio = ActiveRatio(fullWidth,fullHeight,&trueratio);
  }
  DrawFSHUD = windowSize == 0xb;
  R_InitSkyMap();
  centery = viewheight / 2;
  centerx = viewwidth / 2;
  bVar2 = AspectTallerThanWide(WidescreenRatio);
  iVar1 = centerx;
  if (bVar2) {
    centerxwide = centerx;
    DVar5 = FieldOfView;
  }
  else {
    iVar3 = AspectMultiplier(WidescreenRatio);
    centerxwide = (iVar3 * iVar1) / 0x30;
    DVar5 = FieldOfView;
    if (centerxwide != centerx) {
      local_30 = (double)centerx;
      dVar4 = tan(FieldOfView.Degrees * 0.017453292519943295 * 0.5);
      dVar4 = atan((dVar4 * local_30) / (double)centerxwide);
      DVar5.Degrees = (dVar4 + dVar4) * 57.29577951308232;
      if (170.0 < DVar5.Degrees) {
        DVar5.Degrees = 170.0;
      }
    }
  }
  FocalTangent = tan(DVar5.Degrees * 0.017453292519943295 * 0.5);
  (*Renderer->_vptr_FRenderer[0x10])
            ((ulong)(uint)trueratio,Renderer,(ulong)(uint)windowSize,(ulong)(uint)fullWidth,
             (ulong)(uint)fullHeight,(ulong)(uint)stHeight);
  return;
}

Assistant:

void R_SetWindow (int windowSize, int fullWidth, int fullHeight, int stHeight, bool renderingToCanvas)
{
	float trueratio;

	if (windowSize >= 11)
	{
		viewwidth = fullWidth;
		freelookviewheight = viewheight = fullHeight;
	}
	else if (windowSize == 10)
	{
		viewwidth = fullWidth;
		viewheight = stHeight;
		freelookviewheight = fullHeight;
	}
	else
	{
		viewwidth = ((setblocks*fullWidth)/10) & (~15);
		viewheight = ((setblocks*stHeight)/10)&~7;
		freelookviewheight = ((setblocks*fullHeight)/10)&~7;
	}

	if (renderingToCanvas)
	{
		WidescreenRatio = fullWidth / (float)fullHeight;
		trueratio = WidescreenRatio;
	}
	else
	{
		WidescreenRatio = ActiveRatio(fullWidth, fullHeight, &trueratio);
	}

	DrawFSHUD = (windowSize == 11);
	
	// [RH] Sky height fix for screens not 200 (or 240) pixels tall
	R_InitSkyMap ();

	centery = viewheight/2;
	centerx = viewwidth/2;
	if (AspectTallerThanWide(WidescreenRatio))
	{
		centerxwide = centerx;
	}
	else
	{
		centerxwide = centerx * AspectMultiplier(WidescreenRatio) / 48;
	}


	DAngle fov = FieldOfView;

	// For widescreen displays, increase the FOV so that the middle part of the
	// screen that would be visible on a 4:3 display has the requested FOV.
	if (centerxwide != centerx)
	{ // centerxwide is what centerx would be if the display was not widescreen
		fov = DAngle::ToDegrees(2 * atan(centerx * tan(fov.Radians()/2) / double(centerxwide)));
		if (fov > 170.) fov = 170.;
	}
	FocalTangent = tan(fov.Radians() / 2);
	Renderer->SetWindow(windowSize, fullWidth, fullHeight, stHeight, trueratio);
}